

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::Board(Board *this,BoardSize size,BoardMode mode)

{
  mapped_type mVar1;
  pointer puVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  mapped_type *pmVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  key_type local_24;
  long lVar10;
  
  this->size = size;
  pmVar5 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_24);
  mVar1 = *pmVar5;
  this->sizeInt = mVar1;
  this->mode = mode;
  this->nullValue = mVar1 * mVar1 - 1;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->values,mVar1 * mVar1);
  auVar4 = _DAT_00117360;
  puVar2 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    uVar6 = (long)puVar3 + (-8 - (long)puVar2);
    auVar11._8_4_ = (int)uVar6;
    auVar11._0_8_ = uVar6;
    auVar11._12_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6 >> 3;
    auVar8._8_8_ = auVar11._8_8_ >> 3;
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_00117360;
    auVar9 = _DAT_00117350;
    do {
      auVar11 = auVar9 ^ auVar4;
      if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                  auVar8._4_4_ < auVar11._4_4_) & 1)) {
        puVar2[uVar7] = uVar7;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        puVar2[uVar7 + 1] = uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
    } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
  }
  return;
}

Assistant:

Board::Board( BoardSize size, BoardMode mode ) : size( size ),
                                                 mode( mode ),
                                                 sizeInt( Maps::boardSizeInt.at( size )),
                                                 nullValue( sizeInt * sizeInt - 1 )
{
    values.resize( sizeInt * sizeInt );
    std::iota( values.begin(), values.end(), 0 );
}